

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O0

void Abc_SclComputeLoad(SC_Man *p)

{
  SC_WireLoad *pWL;
  int iVar1;
  Abc_Obj_t *pAVar2;
  SC_Cell *p_00;
  Abc_Obj_t *pObj_00;
  SC_Pin *pSVar3;
  SC_Pair *pSVar4;
  Vec_Flt_t *pVVar5;
  SC_Pair *pSVar6;
  float fVar7;
  float fVar8;
  SC_Pair *pLoad_5;
  SC_Pair *pLoad_4;
  int nObjs;
  double TotalLoad;
  SC_Pair *pLoad_3;
  SC_Pair *pLoad_2;
  SC_Pair *pLoadPo;
  SC_Pin *pPin;
  SC_Pair *pLoad_1;
  SC_Cell *pCell;
  SC_Pair *pLoad;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  SC_Man *p_local;
  
  for (pLoad._4_4_ = 0; iVar1 = Vec_PtrSize(p->pNtk->vObjs), (int)pLoad._4_4_ < iVar1;
      pLoad._4_4_ = pLoad._4_4_ + 1) {
    pAVar2 = Abc_NtkObj(p->pNtk,pLoad._4_4_);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      pSVar6 = Abc_SclObjLoad(p,pAVar2);
      iVar1 = Abc_ObjIsPo(pAVar2);
      if (iVar1 == 0) {
        pSVar6->fall = 0.0;
        pSVar6->rise = 0.0;
      }
    }
  }
  for (pLoad._4_4_ = 0; iVar1 = Vec_PtrSize(p->pNtk->vObjs), (int)pLoad._4_4_ < iVar1;
      pLoad._4_4_ = pLoad._4_4_ + 1) {
    pAVar2 = Abc_NtkObj(p->pNtk,pLoad._4_4_);
    if (((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) &&
       (iVar1 = Abc_ObjFaninNum(pAVar2), iVar1 != 0)) {
      p_00 = Abc_SclObjCell(pAVar2);
      for (pLoad._0_4_ = 0; iVar1 = Abc_ObjFaninNum(pAVar2), (int)pLoad < iVar1;
          pLoad._0_4_ = (int)pLoad + 1) {
        pObj_00 = Abc_ObjFanin(pAVar2,(int)pLoad);
        pSVar6 = Abc_SclObjLoad(p,pObj_00);
        pSVar3 = SC_CellPin(p_00,(int)pLoad);
        pSVar6->rise = pSVar3->rise_cap + pSVar6->rise;
        pSVar6->fall = pSVar3->fall_cap + pSVar6->fall;
      }
    }
  }
  for (pLoad._4_4_ = 0; iVar1 = Abc_NtkCoNum(p->pNtk), (int)pLoad._4_4_ < iVar1;
      pLoad._4_4_ = pLoad._4_4_ + 1) {
    pAVar2 = Abc_NtkCo(p->pNtk,pLoad._4_4_);
    pSVar6 = Abc_SclObjLoad(p,pAVar2);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    pSVar4 = Abc_SclObjLoad(p,pAVar2);
    pSVar4->rise = pSVar6->rise + pSVar4->rise;
    pSVar4->fall = pSVar6->fall + pSVar4->fall;
  }
  if (p->pWLoadUsed != (SC_WireLoad *)0x0) {
    if (p->vWireCaps == (Vec_Flt_t *)0x0) {
      pWL = p->pWLoadUsed;
      iVar1 = Abc_NtkGetFanoutMax(p->pNtk);
      pVVar5 = Abc_SclFindWireCaps(pWL,iVar1);
      p->vWireCaps = pVVar5;
    }
    for (pLoad._4_4_ = 0; iVar1 = Vec_PtrSize(p->pNtk->vObjs), (int)pLoad._4_4_ < iVar1;
        pLoad._4_4_ = pLoad._4_4_ + 1) {
      pAVar2 = Abc_NtkObj(p->pNtk,pLoad._4_4_);
      if (((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) &&
         (iVar1 = Abc_ObjFaninNum(pAVar2), iVar1 != 0)) {
        Abc_SclAddWireLoad(p,pAVar2,0);
      }
    }
    for (pLoad._4_4_ = 0; iVar1 = Abc_NtkPiNum(p->pNtk), (int)pLoad._4_4_ < iVar1;
        pLoad._4_4_ = pLoad._4_4_ + 1) {
      pAVar2 = Abc_NtkPi(p->pNtk,pLoad._4_4_);
      Abc_SclAddWireLoad(p,pAVar2,0);
    }
  }
  if (p->vInDrive != (Vec_Flt_t *)0x0) {
    for (pLoad._4_4_ = 0; iVar1 = Abc_NtkPiNum(p->pNtk), (int)pLoad._4_4_ < iVar1;
        pLoad._4_4_ = pLoad._4_4_ + 1) {
      pAVar2 = Abc_NtkPi(p->pNtk,pLoad._4_4_);
      pSVar6 = Abc_SclObjLoad(p,pAVar2);
      fVar7 = Abc_SclObjInDrive(p,pAVar2);
      if (((fVar7 != 0.0) || (NAN(fVar7))) &&
         ((fVar7 = pSVar6->rise, fVar8 = Abc_SclObjInDrive(p,pAVar2), fVar8 < fVar7 ||
          (fVar7 = pSVar6->fall, fVar8 = Abc_SclObjInDrive(p,pAVar2), fVar8 < fVar7)))) {
        printf("Maximum input drive strength is exceeded at primary input %d.\n",(ulong)pLoad._4_4_)
        ;
      }
    }
  }
  fVar7 = 0.0;
  pLoad_4._4_4_ = 0;
  for (pLoad._4_4_ = 0; iVar1 = Vec_PtrSize(p->pNtk->vObjs), (int)pLoad._4_4_ < iVar1;
      pLoad._4_4_ = pLoad._4_4_ + 1) {
    pAVar2 = Abc_NtkObj(p->pNtk,pLoad._4_4_);
    if (((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) &&
       (iVar1 = Abc_ObjFaninNum(pAVar2), iVar1 != 0)) {
      pSVar6 = Abc_SclObjLoad(p,pAVar2);
      fVar7 = pSVar6->fall * 0.5 + pSVar6->rise * 0.5 + fVar7;
      pLoad_4._4_4_ = pLoad_4._4_4_ + 1;
    }
  }
  for (pLoad._4_4_ = 0; iVar1 = Abc_NtkPiNum(p->pNtk), (int)pLoad._4_4_ < iVar1;
      pLoad._4_4_ = pLoad._4_4_ + 1) {
    pAVar2 = Abc_NtkPi(p->pNtk,pLoad._4_4_);
    pSVar6 = Abc_SclObjLoad(p,pAVar2);
    fVar7 = pSVar6->fall * 0.5 + pSVar6->rise * 0.5 + fVar7;
    pLoad_4._4_4_ = pLoad_4._4_4_ + 1;
  }
  p->EstLoadAve = fVar7 / (float)pLoad_4._4_4_;
  return;
}

Assistant:

void Abc_SclComputeLoad( SC_Man * p )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    // clear load storage
    Abc_NtkForEachObj( p->pNtk, pObj, i )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
        if ( !Abc_ObjIsPo(pObj) )
            pLoad->rise = pLoad->fall = 0.0;
    }
    // add cell load
    Abc_NtkForEachNode1( p->pNtk, pObj, i )
    {
        SC_Cell * pCell = Abc_SclObjCell( pObj );
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pFanin );
            SC_Pin * pPin = SC_CellPin( pCell, k );
            pLoad->rise += pPin->rise_cap;
            pLoad->fall += pPin->fall_cap;
        }
    }
    // add PO load
    Abc_NtkForEachCo( p->pNtk, pObj, i )
    {
        SC_Pair * pLoadPo = Abc_SclObjLoad( p, pObj );
        SC_Pair * pLoad = Abc_SclObjLoad( p, Abc_ObjFanin0(pObj) );
        pLoad->rise += pLoadPo->rise;
        pLoad->fall += pLoadPo->fall;
    }
    // add wire load
    if ( p->pWLoadUsed != NULL )
    {
        if ( p->vWireCaps == NULL )
            p->vWireCaps = Abc_SclFindWireCaps( p->pWLoadUsed, Abc_NtkGetFanoutMax(p->pNtk) );
        Abc_NtkForEachNode1( p->pNtk, pObj, i )
            Abc_SclAddWireLoad( p, pObj, 0 );
        Abc_NtkForEachPi( p->pNtk, pObj, i )
            Abc_SclAddWireLoad( p, pObj, 0 );
    }
    // check input loads
    if ( p->vInDrive != NULL )
    {
        Abc_NtkForEachPi( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            if ( Abc_SclObjInDrive(p, pObj) != 0 && (pLoad->rise > Abc_SclObjInDrive(p, pObj) || pLoad->fall > Abc_SclObjInDrive(p, pObj)) )
                printf( "Maximum input drive strength is exceeded at primary input %d.\n", i );
        }
    }
/*
    // transfer load from barbufs
    Abc_NtkForEachBarBuf( p->pNtk, pObj, i )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
        SC_Pair * pLoadF = Abc_SclObjLoad( p, Abc_ObjFanin(pObj, 0) );
        SC_PairAdd( pLoadF, pLoad );
    }
*/
    // calculate average load
//    if ( p->EstLoadMax )
    {
        double TotalLoad = 0;
        int nObjs = 0;
        Abc_NtkForEachNode1( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            TotalLoad += 0.5 * pLoad->fall + 0.5 * pLoad->rise;
            nObjs++;
        }
        Abc_NtkForEachPi( p->pNtk, pObj, i )
        {
            SC_Pair * pLoad = Abc_SclObjLoad( p, pObj );
            TotalLoad += 0.5 * pLoad->fall + 0.5 * pLoad->rise;
            nObjs++;
        }
        p->EstLoadAve = (float)(TotalLoad / nObjs);
//        printf( "Average load = %.2f\n", p->EstLoadAve );
    }
}